

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eigenval.c
# Opt level: O0

double GetMaxEigenval(QMatrix *A,PrecondProcType PrecondProc,double OmegaPrecond)

{
  LASErrIdType LVar1;
  void **ppvVar2;
  char *Object1Name;
  void *local_30;
  EigenvalInfoType *EigenvalInfo;
  double MaxEigenval;
  double OmegaPrecond_local;
  PrecondProcType PrecondProc_local;
  QMatrix *A_local;
  
  Q_Lock(A);
  LVar1 = LASResult();
  if (LVar1 == LASOK) {
    ppvVar2 = Q_EigenvalInfo(A);
    local_30 = *ppvVar2;
    if (local_30 == (void *)0x0) {
      local_30 = malloc(0x20);
      if (local_30 == (void *)0x0) {
        Object1Name = Q_GetName(A);
        LASError(LASMemAllocErr,"GetMaxEigenval",Object1Name,(char *)0x0,(char *)0x0);
      }
      else {
        ppvVar2 = Q_EigenvalInfo(A);
        *ppvVar2 = local_30;
        EstimEigenvals(A,PrecondProc,OmegaPrecond);
      }
    }
    if (((*(PrecondProcType *)((long)local_30 + 0x10) != PrecondProc) ||
        (*(double *)((long)local_30 + 0x18) != OmegaPrecond)) ||
       (NAN(*(double *)((long)local_30 + 0x18)) || NAN(OmegaPrecond))) {
      EstimEigenvals(A,PrecondProc,OmegaPrecond);
    }
    LVar1 = LASResult();
    if (LVar1 == LASOK) {
      EigenvalInfo = *(EigenvalInfoType **)((long)local_30 + 8);
    }
    else {
      EigenvalInfo = (EigenvalInfoType *)0x3ff0000000000000;
    }
  }
  else {
    EigenvalInfo = (EigenvalInfoType *)0x3ff0000000000000;
  }
  return (double)EigenvalInfo;
}

Assistant:

double GetMaxEigenval(QMatrix *A, PrecondProcType PrecondProc, double OmegaPrecond)
/* returns estimate for maximum eigenvalue of the matrix A */
{
    double MaxEigenval;

    EigenvalInfoType *EigenvalInfo;
    
    Q_Lock(A);
    
    if (LASResult() == LASOK) {
        EigenvalInfo = (EigenvalInfoType *)*(Q_EigenvalInfo(A));
        /* if eigenvalues not estimated yet, ... */
        if (EigenvalInfo == NULL) {
            EigenvalInfo = (EigenvalInfoType *)malloc(sizeof(EigenvalInfoType));
            if (EigenvalInfo != NULL) {
	        *(Q_EigenvalInfo(A)) = (void *)EigenvalInfo;
                EstimEigenvals(A, PrecondProc, OmegaPrecond);
            } else {
                LASError(LASMemAllocErr, "GetMaxEigenval", Q_GetName(A), NULL, NULL);
            }
        }
	
        /* if eigenvalues estimated with an other preconditioner, ... */
        if (EigenvalInfo->PrecondProcUsed != PrecondProc
	    || EigenvalInfo->OmegaPrecondUsed != OmegaPrecond) {
            EstimEigenvals(A, PrecondProc, OmegaPrecond);
        }

        if (LASResult() == LASOK)
            MaxEigenval = EigenvalInfo->MaxEigenval;
        else 
            MaxEigenval = 1.0;
    } else {
        MaxEigenval = 1.0;
    }
    
    return(MaxEigenval);             
}